

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcAsset::IfcAsset(IfcAsset *this)

{
  IfcAsset *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x160,"IfcAsset");
  IfcGroup::IfcGroup((IfcGroup *)this,&PTR_construction_vtable_24__00f962c0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAsset,_9UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAsset,_9UL>,
             &PTR_construction_vtable_24__00f96370);
  *(undefined8 *)this = 0xf961e0;
  *(undefined8 *)&this->field_0x160 = 0xf962a8;
  *(undefined8 *)&this->field_0x88 = 0xf96208;
  *(undefined8 *)&this->field_0x98 = 0xf96230;
  *(undefined8 *)&this->field_0xd0 = 0xf96258;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAsset,_9UL>)._vptr_ObjectHelper =
       (_func_int **)0xf96280;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAsset,_9UL>).field_0x10);
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy(&this->OriginalValue,(LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy(&this->CurrentValue,(LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy
            (&this->TotalReplacementCost,(LazyObject *)0x0);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->Owner);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->User);
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy
            (&this->ResponsiblePerson,(LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy
            (&this->IncorporationDate,(LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy
            (&this->DepreciatedValue,(LazyObject *)0x0);
  return;
}

Assistant:

IfcAsset() : Object("IfcAsset") {}